

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_iarchive.h
# Opt level: O0

void __thiscall serialization::xml_iarchive::unserialize_start(xml_iarchive *this)

{
  xml_node<char> *local_70;
  xml_node<char> *node;
  serialization_trace local_11;
  xml_iarchive *pxStack_10;
  serialization_trace trace;
  xml_iarchive *this_local;
  
  pxStack_10 = this;
  serialization_trace::serialization_trace<char_const(&)[18],char_const(&)[4]>
            (&local_11,(char (*) [18])"unserialize_start",(char (*) [4])"xml");
  std::
  stack<rapidxml::xml_node<char>const*,std::deque<rapidxml::xml_node<char>const*,std::allocator<rapidxml::xml_node<char>const*>>>
  ::
  stack<std::deque<rapidxml::xml_node<char>const*,std::allocator<rapidxml::xml_node<char>const*>>,void>
            ((stack<rapidxml::xml_node<char>const*,std::deque<rapidxml::xml_node<char>const*,std::allocator<rapidxml::xml_node<char>const*>>>
              *)&node);
  std::
  stack<const_rapidxml::xml_node<char>_*,_std::deque<const_rapidxml::xml_node<char>_*,_std::allocator<const_rapidxml::xml_node<char>_*>_>_>
  ::operator=(&this->stack_,
              (stack<const_rapidxml::xml_node<char>_*,_std::deque<const_rapidxml::xml_node<char>_*,_std::allocator<const_rapidxml::xml_node<char>_*>_>_>
               *)&node);
  std::
  stack<const_rapidxml::xml_node<char>_*,_std::deque<const_rapidxml::xml_node<char>_*,_std::allocator<const_rapidxml::xml_node<char>_*>_>_>
  ::~stack((stack<const_rapidxml::xml_node<char>_*,_std::deque<const_rapidxml::xml_node<char>_*,_std::allocator<const_rapidxml::xml_node<char>_*>_>_>
            *)&node);
  local_70 = rapidxml::xml_node<char>::first_node((xml_node<char> *)this,"serialization",0,true);
  if (local_70 == (xml_node<char> *)0x0) {
    throw_serialization_error("serilization root","xml");
  }
  std::
  stack<const_rapidxml::xml_node<char>_*,_std::deque<const_rapidxml::xml_node<char>_*,_std::allocator<const_rapidxml::xml_node<char>_*>_>_>
  ::push(&this->stack_,&local_70);
  return;
}

Assistant:

void unserialize_start() const
    {
        serialization_trace trace(__func__, "xml");
        stack_ = std::stack<const rapidxml::xml_node<> *> {};
        auto node = document_.first_node("serialization");
        if(node == nullptr)
            throw_serialization_error("serilization root", "xml");
        stack_.push(node);
    }